

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O2

void __thiscall IlmThread_2_5::Task::Task(Task *this,TaskGroup *g)

{
  this->_vptr_Task = (_func_int **)&PTR__Task_00108ba8;
  this->_group = g;
  if (g != (TaskGroup *)0x0) {
    TaskGroup::Data::addTask(g->_data);
    return;
  }
  return;
}

Assistant:

Task::Task (TaskGroup* g): _group(g)
{
    if ( g )
        g->_data->addTask ();
}